

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult
testing::internal::EqHelper<false>::Compare<int,__0>
          (char *expected_expression,char *actual_expression,int *expected,anon_enum_32 *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar2;
  stringstream ss;
  String local_1e0;
  string local_1d0;
  string local_1b0 [12];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (*expected == *actual) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    PrintToString<int>(local_1b0,expected);
    String::String(&local_1e0,local_1b0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::ostream::_M_insert<long_long>((longlong)&local_1b0[0].field_2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    String::String((String *)local_1b0,&local_1d0);
    std::__cxx11::string::_M_dispose();
    EqFailure((internal *)expected_expression,actual_expression,"CUBEB_OK",&local_1e0,
              (String *)local_1b0,false);
    String::~String((String *)local_1b0);
    String::~String(&local_1e0);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = expected_expression;
  return AVar2;
}

Assistant:

static AssertionResult Compare(const char* expected_expression,
                                 const char* actual_expression,
                                 const T1& expected,
                                 const T2& actual) {
    return CmpHelperEQ(expected_expression, actual_expression, expected,
                       actual);
  }